

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_decoder.cc
# Opt level: O3

Status * __thiscall
draco::ObjDecoder::DecodeInternal(Status *__return_storage_ptr__,ObjDecoder *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  PointCloud *this_00;
  __uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> _Var3;
  size_t sVar4;
  ulong uVar5;
  _Hash_node_base *p_Var6;
  _Head_base<0UL,_draco::AttributeMetadata_*,_false> _Var7;
  bool bVar8;
  ValueType VVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  AttributeMetadata *pAVar13;
  _Rb_tree_header *p_Var14;
  int64_t iVar15;
  FaceIndex face_id;
  long lVar16;
  __node_base *p_Var17;
  DataType DVar18;
  AttributeValueIndex avi;
  int *piVar19;
  AttributeValueIndex i_1;
  undefined4 uStack_104;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  int *local_e8;
  GeometryAttribute va;
  _Head_base<0UL,_draco::AttributeMetadata_*,_false> local_a0;
  _Head_base<0UL,_draco::AttributeMetadata_*,_false> local_98;
  _Head_base<0UL,_draco::AttributeMetadata_*,_false> local_90;
  AttributeMetadata *local_88;
  uint8_t i;
  undefined7 uStack_7f;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  Status status;
  Mesh **local_38;
  
  this->counting_mode_ = true;
  piVar19 = &this->num_obj_faces_;
  this->last_material_id_ = 0;
  this->last_sub_obj_id_ = 0;
  this->num_obj_faces_ = 0;
  this->num_positions_ = 0;
  this->num_tex_coords_ = 0;
  this->num_normals_ = 0;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&(this->material_name_to_id_)._M_h);
  this->last_sub_obj_id_ = 0;
  paVar2 = &status.error_msg_.field_2;
  status.code_ = OK;
  status.error_msg_._M_string_length = 0;
  status.error_msg_.field_2._M_local_buf[0] = '\0';
  status.error_msg_._M_dataplus._M_p = (pointer)paVar2;
  while (bVar8 = ParseDefinition(this,&status), bVar8) {
    if (status.code_ != OK) goto LAB_0011277c;
  }
  if (status.code_ != OK) goto LAB_0011277c;
  if ((this->mesh_files_ !=
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0) && ((this->input_file_name_)._M_string_length != 0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(this->mesh_files_,&this->input_file_name_);
  }
  iVar11 = *piVar19;
  if ((long)iVar11 == 0) {
    iVar10 = this->num_positions_;
    if (iVar10 == 0) {
      va.buffer_ = (DataBuffer *)&va.buffer_descriptor_.buffer_update_count;
      std::__cxx11::string::_M_construct<char_const*>((string *)&va,"No position attribute","");
      __return_storage_ptr__->code_ = DRACO_ERROR;
      (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->error_msg_).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->error_msg_,va.buffer_,
                 (long)&((va.buffer_)->data_).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start +
                 CONCAT44(va.buffer_descriptor_.buffer_id._4_4_,(int)va.buffer_descriptor_.buffer_id
                         ));
    }
    else if (this->num_tex_coords_ == iVar10 || this->num_tex_coords_ < 1) {
      if (this->num_normals_ == iVar10 || this->num_normals_ < 1) {
        this->out_mesh_ = (Mesh *)0x0;
        goto LAB_001128dc;
      }
      va.buffer_ = (DataBuffer *)&va.buffer_descriptor_.buffer_update_count;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&va,"Invalid number of normals for a point cloud","");
      __return_storage_ptr__->code_ = DRACO_ERROR;
      (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->error_msg_).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->error_msg_,va.buffer_,
                 (long)&((va.buffer_)->data_).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start +
                 CONCAT44(va.buffer_descriptor_.buffer_id._4_4_,(int)va.buffer_descriptor_.buffer_id
                         ));
    }
    else {
      va.buffer_ = (DataBuffer *)&va.buffer_descriptor_.buffer_update_count;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&va,"Invalid number of texture coordinates for a point cloud","");
      __return_storage_ptr__->code_ = DRACO_ERROR;
      (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->error_msg_).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->error_msg_,va.buffer_,
                 (long)&((va.buffer_)->data_).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start +
                 CONCAT44(va.buffer_descriptor_.buffer_id._4_4_,(int)va.buffer_descriptor_.buffer_id
                         ));
    }
    if (va.buffer_ != (DataBuffer *)&va.buffer_descriptor_.buffer_update_count) {
      operator_delete(va.buffer_,va.buffer_descriptor_.buffer_update_count + 1);
    }
    goto LAB_001127d5;
  }
  iVar10 = iVar11;
  if (this->out_mesh_ != (Mesh *)0x0) {
    va.buffer_descriptor_.buffer_id._0_4_ = 0;
    va.buffer_ = (DataBuffer *)0x0;
    std::
    vector<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
    ::resize(&(this->out_mesh_->faces_).vector_,(long)iVar11,(value_type *)&va);
    iVar10 = *piVar19;
  }
  if (iVar10 < 1) {
LAB_001128dc:
    VVar9 = this->num_positions_;
    this->out_point_cloud_->num_points_ = VVar9;
  }
  else {
    this->out_point_cloud_->num_points_ = iVar10 * 3;
    VVar9 = this->num_positions_;
  }
  local_38 = &this->out_mesh_;
  if (0 < (int)VVar9) {
    GeometryAttribute::GeometryAttribute(&va);
    GeometryAttribute::Init(&va,POSITION,(DataBuffer *)0x0,'\x03',DT_FLOAT32,false,0xc,0);
    iVar10 = PointCloud::AddAttribute(this->out_point_cloud_,&va,iVar11 == 0,this->num_positions_);
    this->pos_att_id_ = iVar10;
  }
  if (0 < this->num_tex_coords_) {
    GeometryAttribute::GeometryAttribute(&va);
    GeometryAttribute::Init(&va,TEX_COORD,(DataBuffer *)0x0,'\x02',DT_FLOAT32,false,8,0);
    iVar10 = PointCloud::AddAttribute(this->out_point_cloud_,&va,iVar11 == 0,this->num_tex_coords_);
    this->tex_att_id_ = iVar10;
  }
  if (0 < this->num_normals_) {
    GeometryAttribute::GeometryAttribute(&va);
    GeometryAttribute::Init(&va,NORMAL,(DataBuffer *)0x0,'\x03',DT_FLOAT32,false,0xc,0);
    iVar11 = PointCloud::AddAttribute(this->out_point_cloud_,&va,iVar11 == 0,this->num_normals_);
    this->norm_att_id_ = iVar11;
  }
  local_e8 = piVar19;
  if ((this->preserve_polygons_ == true) && (this->has_polygons_ == true)) {
    GeometryAttribute::GeometryAttribute(&va);
    GeometryAttribute::Init(&va,GENERIC,(DataBuffer *)0x0,'\x01',DT_UINT8,false,1,0);
    this_00 = this->out_point_cloud_;
    iVar11 = PointCloud::AddAttribute(this_00,&va,false,2);
    this->added_edge_att_id_ = iVar11;
    _i_1 = (pointer)0x100000000;
    lVar16 = 0;
    do {
      uVar12 = *(uint *)((long)&i_1.value_ + lVar16);
      i = (char)uVar12;
      _Var3._M_t.
      super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
      super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
           (this_00->attributes_).
           super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[this->added_edge_att_id_]._M_t.
           super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
           ._M_t;
      sVar4 = *(size_t *)
               ((long)_Var3._M_t.
                      super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                      .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl + 0x28);
      memcpy((void *)(sVar4 * (uVar12 & 0xff) +
                     **(long **)_Var3._M_t.
                                super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl)
             ,&i,sVar4);
      lVar16 = lVar16 + 4;
    } while (lVar16 != 8);
    pAVar13 = (AttributeMetadata *)operator_new(0x68);
    p_Var14 = (_Rb_tree_header *)(&(pAVar13->super_Metadata).entries_._M_t._M_impl.field_0x0 + 8);
    (((_Rb_tree_header *)(&(pAVar13->super_Metadata).entries_._M_t._M_impl.field_0x0 + 8))->
    _M_header)._M_color = _S_red;
    *(_Base_ptr *)(&(pAVar13->super_Metadata).entries_._M_t._M_impl.field_0x0 + 0x10) =
         (_Base_ptr)0x0;
    *(_Rb_tree_header **)(&(pAVar13->super_Metadata).entries_._M_t._M_impl.field_0x0 + 0x18) =
         p_Var14;
    *(_Rb_tree_header **)(&(pAVar13->super_Metadata).entries_._M_t._M_impl.field_0x0 + 0x20) =
         p_Var14;
    *(size_t *)(&(pAVar13->super_Metadata).entries_._M_t._M_impl.field_0x0 + 0x28) = 0;
    p_Var14 = &(pAVar13->super_Metadata).sub_metadatas_._M_t._M_impl.super__Rb_tree_header;
    (pAVar13->super_Metadata).sub_metadatas_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         _S_red;
    (pAVar13->super_Metadata).sub_metadatas_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
         = (_Base_ptr)0x0;
    (pAVar13->super_Metadata).sub_metadatas_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var14->_M_header;
    (pAVar13->super_Metadata).sub_metadatas_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var14->_M_header;
    (pAVar13->super_Metadata).sub_metadatas_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    pAVar13->att_unique_id_ = 0;
    _i_1 = (pointer)&local_f8;
    local_88 = pAVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)&i_1,"name","");
    _i = (pointer)&local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)&i,"added_edges","");
    Metadata::AddEntryString((Metadata *)pAVar13,(string *)&i_1,(string *)&i);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_i != &local_70) {
      operator_delete(_i,local_70._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_i_1 != &local_f8) {
      operator_delete(_i_1,local_f8._M_allocated_capacity + 1);
    }
    local_90._M_head_impl = pAVar13;
    PointCloud::AddAttributeMetadata
              (this_00,this->added_edge_att_id_,
               (unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                *)&local_90);
    _Var7._M_head_impl = local_90._M_head_impl;
    piVar19 = local_e8;
    if (local_90._M_head_impl != (AttributeMetadata *)0x0) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>_>_>
      ::~_Rb_tree(&((local_90._M_head_impl)->super_Metadata).sub_metadatas_._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
                   *)_Var7._M_head_impl);
      operator_delete(_Var7._M_head_impl,0x68);
    }
    local_90._M_head_impl = (AttributeMetadata *)0x0;
  }
  uVar12 = this->num_obj_faces_;
  if (0 < (int)uVar12 && 0 < this->num_materials_) {
    GeometryAttribute::GeometryAttribute(&va);
    uVar12 = this->num_materials_;
    bVar8 = 0xffff < uVar12;
    DVar18 = DT_UINT8;
    if (0xff < (int)uVar12) {
      DVar18 = bVar8 + 4 + (uint)bVar8;
    }
    iVar15 = 1;
    if (0xff < (int)uVar12) {
      iVar15 = (ulong)((uint)bVar8 * 2) + 2;
    }
    GeometryAttribute::Init(&va,GENERIC,(DataBuffer *)0x0,'\x01',DVar18,false,iVar15,0);
    iVar11 = PointCloud::AddAttribute(this->out_point_cloud_,&va,false,this->num_materials_);
    this->material_att_id_ = iVar11;
    _i_1 = _i_1 & 0xffffffff00000000;
    if (0 < this->num_materials_) {
      lVar16 = 0;
      do {
        _Var3._M_t.
        super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
        .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
             (this->out_point_cloud_->attributes_).
             super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[this->material_att_id_]._M_t.
             super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
             ._M_t;
        sVar4 = *(size_t *)
                 ((long)_Var3._M_t.
                        super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                        .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl + 0x28);
        memcpy((void *)(sVar4 * lVar16 +
                       **(long **)_Var3._M_t.
                                  super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                  .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                  _M_head_impl),&i_1,sVar4);
        lVar16 = lVar16 + 1;
        i_1.value_ = (int)lVar16;
      } while (lVar16 < this->num_materials_);
    }
    piVar19 = local_e8;
    if (this->use_metadata_ != false) {
      pAVar13 = (AttributeMetadata *)operator_new(0x68);
      p_Var14 = (_Rb_tree_header *)(&(pAVar13->super_Metadata).entries_._M_t._M_impl.field_0x0 + 8);
      (((_Rb_tree_header *)(&(pAVar13->super_Metadata).entries_._M_t._M_impl.field_0x0 + 8))->
      _M_header)._M_color = _S_red;
      *(_Base_ptr *)(&(pAVar13->super_Metadata).entries_._M_t._M_impl.field_0x0 + 0x10) =
           (_Base_ptr)0x0;
      *(_Rb_tree_header **)(&(pAVar13->super_Metadata).entries_._M_t._M_impl.field_0x0 + 0x18) =
           p_Var14;
      *(_Rb_tree_header **)(&(pAVar13->super_Metadata).entries_._M_t._M_impl.field_0x0 + 0x20) =
           p_Var14;
      *(size_t *)(&(pAVar13->super_Metadata).entries_._M_t._M_impl.field_0x0 + 0x28) = 0;
      p_Var14 = &(pAVar13->super_Metadata).sub_metadatas_._M_t._M_impl.super__Rb_tree_header;
      (pAVar13->super_Metadata).sub_metadatas_._M_t._M_impl.super__Rb_tree_header._M_header._M_color
           = _S_red;
      (pAVar13->super_Metadata).sub_metadatas_._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_parent = (_Base_ptr)0x0;
      (pAVar13->super_Metadata).sub_metadatas_._M_t._M_impl.super__Rb_tree_header._M_header._M_left
           = &p_Var14->_M_header;
      (pAVar13->super_Metadata).sub_metadatas_._M_t._M_impl.super__Rb_tree_header._M_header._M_right
           = &p_Var14->_M_header;
      (pAVar13->super_Metadata).sub_metadatas_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      pAVar13->att_unique_id_ = 0;
      _i_1 = (pointer)&local_f8;
      local_88 = pAVar13;
      std::__cxx11::string::_M_construct<char_const*>((string *)&i_1,"name","");
      _i = (pointer)&local_70;
      std::__cxx11::string::_M_construct<char_const*>((string *)&i,"material","");
      Metadata::AddEntryString((Metadata *)pAVar13,(string *)&i_1,(string *)&i);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_i != &local_70) {
        operator_delete(_i,local_70._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_i_1 != &local_f8) {
        operator_delete(_i_1,local_f8._M_allocated_capacity + 1);
      }
      p_Var17 = &(this->material_name_to_id_)._M_h._M_before_begin;
      while (p_Var17 = p_Var17->_M_nxt, p_Var17 != (__node_base *)0x0) {
        Metadata::AddEntryInt
                  ((Metadata *)pAVar13,(string *)(p_Var17 + 1),*(int32_t *)&p_Var17[5]._M_nxt);
      }
      if ((this->material_file_name_)._M_string_length != 0) {
        _i_1 = (pointer)&local_f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&i_1,"file_name","");
        Metadata::AddEntryString((Metadata *)pAVar13,(string *)&i_1,&this->material_file_name_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_i_1 != &local_f8) {
          operator_delete(_i_1,local_f8._M_allocated_capacity + 1);
        }
      }
      local_98._M_head_impl = pAVar13;
      PointCloud::AddAttributeMetadata
                (this->out_point_cloud_,this->material_att_id_,
                 (unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                  *)&local_98);
      _Var7._M_head_impl = local_98._M_head_impl;
      piVar19 = local_e8;
      if (local_98._M_head_impl != (AttributeMetadata *)0x0) {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>_>_>
        ::~_Rb_tree(&((local_98._M_head_impl)->super_Metadata).sub_metadatas_._M_t);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
                     *)_Var7._M_head_impl);
        operator_delete(_Var7._M_head_impl,0x68);
      }
      local_98._M_head_impl = (AttributeMetadata *)0x0;
    }
    uVar12 = *piVar19;
  }
  if (((this->obj_name_to_id_)._M_h._M_element_count != 0) && (0 < (int)uVar12)) {
    GeometryAttribute::GeometryAttribute(&va);
    uVar5 = (this->obj_name_to_id_)._M_h._M_element_count;
    bVar8 = 0xffff < uVar5;
    DVar18 = DT_UINT8;
    if (0xff < uVar5) {
      DVar18 = bVar8 + 4 + (uint)bVar8;
    }
    iVar15 = 1;
    if (0xff < uVar5) {
      iVar15 = (ulong)((uint)bVar8 * 2) + 2;
    }
    GeometryAttribute::Init(&va,GENERIC,(DataBuffer *)0x0,'\x01',DVar18,false,iVar15,0);
    iVar11 = PointCloud::AddAttribute
                       (this->out_point_cloud_,&va,false,
                        (ValueType)(this->obj_name_to_id_)._M_h._M_element_count);
    this->sub_obj_att_id_ = iVar11;
    piVar19 = local_e8;
    for (p_Var6 = (this->obj_name_to_id_)._M_h._M_before_begin._M_nxt; local_e8 = piVar19,
        p_Var6 != (_Hash_node_base *)0x0; p_Var6 = p_Var6->_M_nxt) {
      uStack_104 = (undefined4)((ulong)_i_1 >> 0x20);
      i_1.value_ = *(uint *)&p_Var6[5]._M_nxt;
      _Var3._M_t.
      super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
      super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
           (this->out_point_cloud_->attributes_).
           super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[this->sub_obj_att_id_]._M_t.
           super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
           ._M_t;
      sVar4 = *(size_t *)
               ((long)_Var3._M_t.
                      super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                      .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl + 0x28);
      memcpy((void *)(*(uint *)&p_Var6[5]._M_nxt * sVar4 +
                     **(long **)_Var3._M_t.
                                super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl)
             ,&i_1,sVar4);
      piVar19 = local_e8;
    }
    if (this->use_metadata_ != false) {
      pAVar13 = (AttributeMetadata *)operator_new(0x68);
      p_Var14 = (_Rb_tree_header *)(&(pAVar13->super_Metadata).entries_._M_t._M_impl.field_0x0 + 8);
      (((_Rb_tree_header *)(&(pAVar13->super_Metadata).entries_._M_t._M_impl.field_0x0 + 8))->
      _M_header)._M_color = _S_red;
      *(_Base_ptr *)(&(pAVar13->super_Metadata).entries_._M_t._M_impl.field_0x0 + 0x10) =
           (_Base_ptr)0x0;
      *(_Rb_tree_header **)(&(pAVar13->super_Metadata).entries_._M_t._M_impl.field_0x0 + 0x18) =
           p_Var14;
      *(_Rb_tree_header **)(&(pAVar13->super_Metadata).entries_._M_t._M_impl.field_0x0 + 0x20) =
           p_Var14;
      *(size_t *)(&(pAVar13->super_Metadata).entries_._M_t._M_impl.field_0x0 + 0x28) = 0;
      p_Var14 = &(pAVar13->super_Metadata).sub_metadatas_._M_t._M_impl.super__Rb_tree_header;
      (pAVar13->super_Metadata).sub_metadatas_._M_t._M_impl.super__Rb_tree_header._M_header._M_color
           = _S_red;
      (pAVar13->super_Metadata).sub_metadatas_._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_parent = (_Base_ptr)0x0;
      (pAVar13->super_Metadata).sub_metadatas_._M_t._M_impl.super__Rb_tree_header._M_header._M_left
           = &p_Var14->_M_header;
      (pAVar13->super_Metadata).sub_metadatas_._M_t._M_impl.super__Rb_tree_header._M_header._M_right
           = &p_Var14->_M_header;
      (pAVar13->super_Metadata).sub_metadatas_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      pAVar13->att_unique_id_ = 0;
      _i_1 = (pointer)&local_f8;
      local_88 = pAVar13;
      std::__cxx11::string::_M_construct<char_const*>((string *)&i_1,"name","");
      _i = (pointer)&local_70;
      std::__cxx11::string::_M_construct<char_const*>((string *)&i,"sub_obj","");
      Metadata::AddEntryString((Metadata *)pAVar13,(string *)&i_1,(string *)&i);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_i != &local_70) {
        operator_delete(_i,local_70._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_i_1 != &local_f8) {
        operator_delete(_i_1,local_f8._M_allocated_capacity + 1);
      }
      p_Var17 = &(this->obj_name_to_id_)._M_h._M_before_begin;
      while (p_Var17 = p_Var17->_M_nxt, p_Var17 != (__node_base *)0x0) {
        Metadata::AddEntryInt
                  ((Metadata *)pAVar13,(string *)(p_Var17 + 1),*(int32_t *)&p_Var17[5]._M_nxt);
      }
      local_a0._M_head_impl = pAVar13;
      PointCloud::AddAttributeMetadata
                (this->out_point_cloud_,this->sub_obj_att_id_,
                 (unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                  *)&local_a0);
      _Var7._M_head_impl = local_a0._M_head_impl;
      piVar19 = local_e8;
      if (local_a0._M_head_impl != (AttributeMetadata *)0x0) {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>_>_>
        ::~_Rb_tree(&((local_a0._M_head_impl)->super_Metadata).sub_metadatas_._M_t);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
                     *)_Var7._M_head_impl);
        operator_delete(_Var7._M_head_impl,0x68);
      }
      local_a0._M_head_impl = (AttributeMetadata *)0x0;
    }
  }
  this->counting_mode_ = false;
  this->last_material_id_ = 0;
  this->last_sub_obj_id_ = 0;
  *(undefined8 *)piVar19 = 0;
  *(undefined8 *)(piVar19 + 2) = 0;
  (this->buffer_).pos_ = 0;
  do {
    bVar8 = ParseDefinition(this,&status);
    if (!bVar8) {
      if (status.code_ != OK) break;
      if (*local_38 != (Mesh *)0x0) {
        va.buffer_descriptor_.buffer_id._0_4_ = 0;
        va.buffer_ = (DataBuffer *)0x0;
        if (*piVar19 != 0) {
          iVar11 = 0;
          face_id.value_ = 0;
          do {
            va.buffer_ = (DataBuffer *)CONCAT44(iVar11 + 1,iVar11);
            va.buffer_descriptor_.buffer_id._0_4_ = iVar11 + 2;
            Mesh::SetFace(*local_38,face_id,(Face *)&va);
            face_id.value_ = face_id.value_ + 1;
            iVar11 = iVar11 + 3;
          } while (face_id.value_ < (uint)*local_e8);
        }
      }
      if (this->deduplicate_input_values_ == true) {
        (*this->out_point_cloud_->_vptr_PointCloud[4])();
      }
      (*this->out_point_cloud_->_vptr_PointCloud[5])();
      __return_storage_ptr__->code_ = status.code_;
      goto LAB_0011277e;
    }
  } while (status.code_ == OK);
LAB_0011277c:
  __return_storage_ptr__->code_ = status.code_;
LAB_0011277e:
  paVar1 = &(__return_storage_ptr__->error_msg_).field_2;
  (__return_storage_ptr__->error_msg_)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)status.error_msg_._M_dataplus._M_p == paVar2) {
    paVar1->_M_allocated_capacity =
         CONCAT71(status.error_msg_.field_2._M_allocated_capacity._1_7_,
                  status.error_msg_.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->error_msg_).field_2 + 8) =
         status.error_msg_.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->error_msg_)._M_dataplus._M_p = status.error_msg_._M_dataplus._M_p;
    (__return_storage_ptr__->error_msg_).field_2._M_allocated_capacity =
         CONCAT71(status.error_msg_.field_2._M_allocated_capacity._1_7_,
                  status.error_msg_.field_2._M_local_buf[0]);
  }
  (__return_storage_ptr__->error_msg_)._M_string_length = status.error_msg_._M_string_length;
  status.error_msg_._M_string_length = 0;
  status.error_msg_.field_2._M_local_buf[0] = '\0';
  status.error_msg_._M_dataplus._M_p = (pointer)paVar2;
LAB_001127d5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)status.error_msg_._M_dataplus._M_p != paVar2) {
    operator_delete(status.error_msg_._M_dataplus._M_p,
                    CONCAT71(status.error_msg_.field_2._M_allocated_capacity._1_7_,
                             status.error_msg_.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Status ObjDecoder::DecodeInternal() {
  // In the first pass, count the number of different elements in the geometry.
  // In case the desired output is just a point cloud (i.e., when
  // out_mesh_ == nullptr) the decoder will ignore all information about the
  // connectivity that may be included in the source data.
  counting_mode_ = true;
  ResetCounters();
  material_name_to_id_.clear();
  last_sub_obj_id_ = 0;
  // Parse all lines.
  Status status(Status::OK);
  while (ParseDefinition(&status) && status.ok()) {
  }
  if (!status.ok()) {
    return status;
  }

  if (mesh_files_ && !input_file_name_.empty()) {
    mesh_files_->push_back(input_file_name_);
  }

  bool use_identity_mapping = false;
  if (num_obj_faces_ == 0) {
    // Mesh has no faces. In this case we try to read the geometry as a point
    // cloud where every attribute entry is a point.

    // Ensure the number of all entries is same for all attributes.
    if (num_positions_ == 0) {
      return Status(Status::DRACO_ERROR, "No position attribute");
    }
    if (num_tex_coords_ > 0 && num_tex_coords_ != num_positions_) {
      return Status(Status::DRACO_ERROR,
                    "Invalid number of texture coordinates for a point cloud");
    }
    if (num_normals_ > 0 && num_normals_ != num_positions_) {
      return Status(Status::DRACO_ERROR,
                    "Invalid number of normals for a point cloud");
    }

    out_mesh_ = nullptr;  // Treat the output geometry as a point cloud.
    use_identity_mapping = true;
  }

  // Initialize point cloud and mesh properties.
  if (out_mesh_) {
    // Start decoding a mesh with the given number of faces. For point clouds we
    // silently ignore all data about the mesh connectivity.
    out_mesh_->SetNumFaces(num_obj_faces_);
  }
  if (num_obj_faces_ > 0) {
    out_point_cloud_->set_num_points(3 * num_obj_faces_);
  } else {
    out_point_cloud_->set_num_points(num_positions_);
  }

  // Add attributes if they are present in the input data.
  if (num_positions_ > 0) {
    GeometryAttribute va;
    va.Init(GeometryAttribute::POSITION, nullptr, 3, DT_FLOAT32, false,
            sizeof(float) * 3, 0);
    pos_att_id_ = out_point_cloud_->AddAttribute(va, use_identity_mapping,
                                                 num_positions_);
  }
  if (num_tex_coords_ > 0) {
    GeometryAttribute va;
    va.Init(GeometryAttribute::TEX_COORD, nullptr, 2, DT_FLOAT32, false,
            sizeof(float) * 2, 0);
    tex_att_id_ = out_point_cloud_->AddAttribute(va, use_identity_mapping,
                                                 num_tex_coords_);
  }
  if (num_normals_ > 0) {
    GeometryAttribute va;
    va.Init(GeometryAttribute::NORMAL, nullptr, 3, DT_FLOAT32, false,
            sizeof(float) * 3, 0);
    norm_att_id_ =
        out_point_cloud_->AddAttribute(va, use_identity_mapping, num_normals_);
  }
  if (preserve_polygons_ && has_polygons_) {
    // Create attribute for polygon reconstruction.
    GeometryAttribute va;
    va.Init(GeometryAttribute::GENERIC, nullptr, 1, DT_UINT8, false, 1, 0);
    PointCloud *const pc = out_point_cloud_;
    added_edge_att_id_ = pc->AddAttribute(va, false, 2);

    // Set attribute values to zero and one representing old edge and new edge.
    for (const uint8_t i : {0, 1}) {
      const AttributeValueIndex avi(i);
      pc->attribute(added_edge_att_id_)->SetAttributeValue(avi, &i);
    }

    // Add attribute metadata with name.
    std::unique_ptr<AttributeMetadata> metadata(new draco::AttributeMetadata());
    metadata->AddEntryString("name", "added_edges");
    pc->AddAttributeMetadata(added_edge_att_id_, std::move(metadata));
  }
  if (num_materials_ > 0 && num_obj_faces_ > 0) {
    GeometryAttribute va;
    const auto geometry_attribute_type = GeometryAttribute::GENERIC;
    if (num_materials_ < 256) {
      va.Init(geometry_attribute_type, nullptr, 1, DT_UINT8, false, 1, 0);
    } else if (num_materials_ < (1 << 16)) {
      va.Init(geometry_attribute_type, nullptr, 1, DT_UINT16, false, 2, 0);
    } else {
      va.Init(geometry_attribute_type, nullptr, 1, DT_UINT32, false, 4, 0);
    }
    material_att_id_ =
        out_point_cloud_->AddAttribute(va, false, num_materials_);

    // Fill the material entries.
    for (int i = 0; i < num_materials_; ++i) {
      const AttributeValueIndex avi(i);
      out_point_cloud_->attribute(material_att_id_)->SetAttributeValue(avi, &i);
    }

    if (use_metadata_) {
      // Use metadata to store the name of materials.
      std::unique_ptr<AttributeMetadata> material_metadata =
          std::unique_ptr<AttributeMetadata>(new AttributeMetadata());
      material_metadata->AddEntryString("name", "material");
      // Add all material names.
      for (const auto &itr : material_name_to_id_) {
        material_metadata->AddEntryInt(itr.first, itr.second);
      }
      if (!material_file_name_.empty()) {
        material_metadata->AddEntryString("file_name", material_file_name_);
      }

      out_point_cloud_->AddAttributeMetadata(material_att_id_,
                                             std::move(material_metadata));
    }
  }
  if (!obj_name_to_id_.empty() && num_obj_faces_ > 0) {
    GeometryAttribute va;
    if (obj_name_to_id_.size() < 256) {
      va.Init(GeometryAttribute::GENERIC, nullptr, 1, DT_UINT8, false, 1, 0);
    } else if (obj_name_to_id_.size() < (1 << 16)) {
      va.Init(GeometryAttribute::GENERIC, nullptr, 1, DT_UINT16, false, 2, 0);
    } else {
      va.Init(GeometryAttribute::GENERIC, nullptr, 1, DT_UINT32, false, 4, 0);
    }
    sub_obj_att_id_ = out_point_cloud_->AddAttribute(
        va, false, static_cast<uint32_t>(obj_name_to_id_.size()));
    // Fill the sub object id entries.
    for (const auto &itr : obj_name_to_id_) {
      const AttributeValueIndex i(itr.second);
      out_point_cloud_->attribute(sub_obj_att_id_)->SetAttributeValue(i, &i);
    }
    if (use_metadata_) {
      // Use metadata to store the name of materials.
      std::unique_ptr<AttributeMetadata> sub_obj_metadata =
          std::unique_ptr<AttributeMetadata>(new AttributeMetadata());
      sub_obj_metadata->AddEntryString("name", "sub_obj");
      // Add all sub object names.
      for (const auto &itr : obj_name_to_id_) {
        const AttributeValueIndex i(itr.second);
        sub_obj_metadata->AddEntryInt(itr.first, itr.second);
      }
      out_point_cloud_->AddAttributeMetadata(sub_obj_att_id_,
                                             std::move(sub_obj_metadata));
    }
  }

  // Perform a second iteration of parsing and fill all the data.
  counting_mode_ = false;
  ResetCounters();
  // Start parsing from the beginning of the buffer again.
  buffer()->StartDecodingFrom(0);
  while (ParseDefinition(&status) && status.ok()) {
  }
  if (!status.ok()) {
    return status;
  }
  if (out_mesh_) {
    // Add faces with identity mapping between vertex and corner indices.
    // Duplicate vertices will get removed later.
    Mesh::Face face;
    for (FaceIndex i(0); i < num_obj_faces_; ++i) {
      for (int c = 0; c < 3; ++c) {
        face[c] = 3 * i.value() + c;
      }
      out_mesh_->SetFace(i, face);
    }
  }

#ifdef DRACO_ATTRIBUTE_VALUES_DEDUPLICATION_SUPPORTED
  if (deduplicate_input_values_) {
    out_point_cloud_->DeduplicateAttributeValues();
  }
#endif
#ifdef DRACO_ATTRIBUTE_INDICES_DEDUPLICATION_SUPPORTED
  out_point_cloud_->DeduplicatePointIds();
#endif
  return status;
}